

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O3

void __thiscall c4::yml::Tree::_swap_props(Tree *this,size_t n_,size_t m_)

{
  csubstr *pcVar1;
  csubstr *pcVar2;
  NodeData *pNVar3;
  NodeType_e NVar4;
  code *pcVar5;
  char *pcVar6;
  size_t sVar7;
  char *pcVar8;
  size_t sVar9;
  char *pcVar10;
  size_t sVar11;
  char *pcVar12;
  size_t sVar13;
  char *pcVar14;
  size_t sVar15;
  size_t sVar16;
  bool bVar17;
  NodeData *pNVar18;
  ulong uVar19;
  NodeScalar __tmp;
  
  uVar19 = this->m_cap;
  if (n_ == 0xffffffffffffffff || uVar19 <= n_) {
    if (((byte)s_error_flags & 1) != 0) {
      bVar17 = is_debugger_attached();
      if (bVar17) {
        pcVar5 = (code *)swi(3);
        (*pcVar5)();
        return;
      }
    }
    (*(code *)PTR_error_impl_0023f548)
              ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
               (anonymous_namespace)::s_default_callbacks);
    uVar19 = this->m_cap;
  }
  pNVar3 = this->m_buf;
  if ((m_ == 0xffffffffffffffff) || (pNVar18 = pNVar3, uVar19 <= m_)) {
    if (((byte)s_error_flags & 1) != 0) {
      bVar17 = is_debugger_attached();
      if (bVar17) {
        pcVar5 = (code *)swi(3);
        (*pcVar5)();
        return;
      }
    }
    (*(code *)PTR_error_impl_0023f548)
              ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
               (anonymous_namespace)::s_default_callbacks);
    pNVar18 = this->m_buf;
  }
  NVar4 = pNVar3[n_].m_type.type;
  pNVar3[n_].m_type.type = pNVar18[m_].m_type.type;
  pNVar18[m_].m_type.type = NVar4;
  pcVar6 = pNVar3[n_].m_key.tag.str;
  sVar7 = pNVar3[n_].m_key.tag.len;
  pcVar1 = &pNVar3[n_].m_key.scalar;
  pcVar8 = pcVar1->str;
  sVar9 = pcVar1->len;
  pcVar1 = &pNVar3[n_].m_key.anchor;
  pcVar10 = pcVar1->str;
  sVar11 = pcVar1->len;
  pcVar12 = pNVar18[m_].m_key.tag.str;
  sVar13 = pNVar18[m_].m_key.tag.len;
  pcVar1 = &pNVar18[m_].m_key.scalar;
  pcVar14 = pcVar1->str;
  sVar15 = pcVar1->len;
  pcVar1 = &pNVar18[m_].m_key.anchor;
  sVar16 = pcVar1->len;
  pcVar2 = &pNVar3[n_].m_key.anchor;
  pcVar2->str = pcVar1->str;
  pcVar2->len = sVar16;
  pcVar1 = &pNVar3[n_].m_key.scalar;
  pcVar1->str = pcVar14;
  pcVar1->len = sVar15;
  pNVar3[n_].m_key.tag.str = pcVar12;
  pNVar3[n_].m_key.tag.len = sVar13;
  pcVar1 = &pNVar18[m_].m_key.anchor;
  pcVar1->str = pcVar10;
  pcVar1->len = sVar11;
  pcVar1 = &pNVar18[m_].m_key.scalar;
  pcVar1->str = pcVar8;
  pcVar1->len = sVar9;
  pNVar18[m_].m_key.tag.str = pcVar6;
  pNVar18[m_].m_key.tag.len = sVar7;
  pcVar6 = pNVar3[n_].m_val.tag.str;
  sVar7 = pNVar3[n_].m_val.tag.len;
  pcVar1 = &pNVar3[n_].m_val.scalar;
  pcVar8 = pcVar1->str;
  sVar9 = pcVar1->len;
  pcVar1 = &pNVar3[n_].m_val.anchor;
  pcVar10 = pcVar1->str;
  sVar11 = pcVar1->len;
  pcVar12 = pNVar18[m_].m_val.tag.str;
  sVar13 = pNVar18[m_].m_val.tag.len;
  pcVar1 = &pNVar18[m_].m_val.scalar;
  pcVar14 = pcVar1->str;
  sVar15 = pcVar1->len;
  pcVar1 = &pNVar18[m_].m_val.anchor;
  sVar16 = pcVar1->len;
  pcVar2 = &pNVar3[n_].m_val.anchor;
  pcVar2->str = pcVar1->str;
  pcVar2->len = sVar16;
  pcVar1 = &pNVar3[n_].m_val.scalar;
  pcVar1->str = pcVar14;
  pcVar1->len = sVar15;
  pNVar3[n_].m_val.tag.str = pcVar12;
  pNVar3[n_].m_val.tag.len = sVar13;
  pcVar1 = &pNVar18[m_].m_val.anchor;
  pcVar1->str = pcVar10;
  pcVar1->len = sVar11;
  pcVar1 = &pNVar18[m_].m_val.scalar;
  pcVar1->str = pcVar8;
  pcVar1->len = sVar9;
  pNVar18[m_].m_val.tag.str = pcVar6;
  pNVar18[m_].m_val.tag.len = sVar7;
  return;
}

Assistant:

void Tree::_swap_props(size_t n_, size_t m_)
{
    NodeData &C4_RESTRICT n = *_p(n_);
    NodeData &C4_RESTRICT m = *_p(m_);
    std::swap(n.m_type, m.m_type);
    std::swap(n.m_key, m.m_key);
    std::swap(n.m_val, m.m_val);
}